

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseExpectedNan(WastParser *this,ExpectedNan *expected)

{
  TokenType TVar1;
  ExpectedNan EVar2;
  Token local_50;
  
  TVar1 = Peek(this,0);
  if (TVar1 == NanArithmetic) {
    EVar2 = Arithmetic;
  }
  else {
    EVar2 = Canonical;
    if (TVar1 != NanCanonical) {
      return (Result)Error;
    }
  }
  *expected = EVar2;
  Consume(&local_50,this);
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseExpectedNan(ExpectedNan* expected) {
  WABT_TRACE(ParseExpectedNan);
  TokenType token_type = Peek();
  switch (token_type) {
    case TokenType::NanArithmetic:
      *expected = ExpectedNan::Arithmetic;
      break;
    case TokenType::NanCanonical:
      *expected = ExpectedNan::Canonical;
      break;
    default:
      return Result::Error;
  }
  Consume();
  return Result::Ok;
}